

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# notch_io.hpp
# Opt level: O3

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
notch::io::PlainTextNetworkReader::read_value<std::__cxx11::string>
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__
          ,PlainTextNetworkReader *this,istream *in,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *value)

{
  pointer pcVar1;
  istream *piVar2;
  
  piVar2 = std::ws<char,std::char_traits<char>>(in);
  piVar2 = std::operator>>(piVar2,(string *)value);
  std::ws<char,std::char_traits<char>>(piVar2);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar1 = (value->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,pcVar1,pcVar1 + value->_M_string_length);
  return __return_storage_ptr__;
}

Assistant:

T
    read_value(std::istream &in, T &value) {
       in >> std::ws >> value >> std::ws;
       return value;
    }